

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl_window.cpp
# Opt level: O1

void __thiscall sdl::window::window(window *this,u8string *title,SDL_Rect *window_rect)

{
  SDL_Window *retval;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_type local_28;
  
  SDL_LogDebug(5,"Creating window \"%s\" at %d:%d with the size of %dx%d",(title->_M_dataplus)._M_p,
               window_rect->x,window_rect->y,window_rect->w,window_rect->h);
  retval = (SDL_Window *)
           SDL_CreateWindow((title->_M_dataplus)._M_p,window_rect->x,window_rect->y,window_rect->w,
                            window_rect->h,0);
  this->m_window = retval;
  local_28 = 0x17;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_48,&local_28,0);
  local_48.field_2._M_allocated_capacity = local_28;
  builtin_strncpy(local_48._M_dataplus._M_p,"Failed to create window",0x17);
  local_48._M_string_length = local_28;
  local_48._M_dataplus._M_p[local_28] = '\0';
  sdl_check_null(retval,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

window::window(const std::u8string& title, const SDL_Rect& window_rect)
{
	SDL_LogDebug(SDL_LOG_CATEGORY_VIDEO, "Creating window \"%s\" at %d:%d with the size of %dx%d",
		reinterpret_cast<const char*>(title.c_str()), window_rect.x, window_rect.y,
		window_rect.w, window_rect.h);

	// Create window
	this->m_window = SDL_CreateWindow(reinterpret_cast<const char*>(title.c_str()),
		window_rect.x, window_rect.y, window_rect.w, window_rect.h, 0);

	sdl::sdl_check_null(this->m_window, "Failed to create window"s);
}